

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void setsvar(char *name,char *str,bool dofunc)

{
  ident *this;
  char *pcVar1;
  ident *id;
  bool dofunc_local;
  char *str_local;
  char *name_local;
  
  str_local = name;
  this = hashset<ident>::access<char_const*>(&idents,&str_local);
  if ((this != (ident *)0x0) && (this->type == 2)) {
    if (((identflags & 0x10U) == 0) && ((this->flags & 2U) == 0)) {
      if ((this->flags & 0x10U) != 0) {
        if ((this->field_5).stack != (identstack *)0x0) {
          operator_delete__((this->field_5).stack);
        }
        this->flags = this->flags & 0xffffffef;
      }
      if (*(void **)(this->field_4).args != (void *)0x0) {
        operator_delete__(*(void **)(this->field_4).args);
      }
    }
    else {
      if ((this->flags & 1U) != 0) {
        debugcode("cannot override persistent variable %s",this->name);
        return;
      }
      if ((this->flags & 0x10U) == 0) {
        this->field_5 = *(anon_union_8_3_5b305ad5_for_ident_8 *)(this->field_4).args;
        this->flags = this->flags | 0x10;
      }
      else if (*(void **)(this->field_4).args != (void *)0x0) {
        operator_delete__(*(void **)(this->field_4).args);
      }
    }
    pcVar1 = newstring(str);
    *(char **)(this->field_4).args = pcVar1;
    if (dofunc) {
      ident::changed(this);
    }
  }
  return;
}

Assistant:

void setsvar(const char *name, const char *str, bool dofunc)
{
    _GETVAR(id, ID_SVAR, name, );
    OVERRIDEVAR(return, id->overrideval.s = *id->storage.s, delete[] id->overrideval.s, delete[] *id->storage.s);
    *id->storage.s = newstring(str);
    if(dofunc) id->changed();
}